

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msd_dyn_vector.cpp
# Opt level: O3

void msd_D_adaptive<std::deque<unsigned_char*,std::allocator<unsigned_char*>>>
               (uchar **strings,size_t n,size_t depth,
               deque<unsigned_char_*,_std::allocator<unsigned_char_*>_> *buckets)

{
  deque<unsigned_char*,std::allocator<unsigned_char*>> *pdVar1;
  _Map_pointer pppuVar2;
  long lVar3;
  uchar *puVar4;
  undefined8 *puVar5;
  long *plVar6;
  size_t n_00;
  size_t j;
  long *__ptr;
  long lVar7;
  _Map_pointer *ppppuVar8;
  undefined2 uVar9;
  ulong uVar10;
  uint uVar11;
  uchar **__args;
  uchar **ppuVar12;
  uint i;
  size_t j_1;
  long lVar13;
  ulong uVar14;
  _Elt_pointer *pppuVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  uint16_t cache [16];
  _Deque_iterator<unsigned_char_*,_unsigned_char_*const_&,_unsigned_char_*const_*> local_78;
  _Deque_iterator<unsigned_char_*,_unsigned_char_*const_&,_unsigned_char_*const_*> local_58;
  
  if (n < 0x10000) {
    msd_D<std::deque<unsigned_char*,std::allocator<unsigned_char*>>,unsigned_short>
              (strings,n,depth,buckets);
    return;
  }
  __ptr = (long *)malloc(0x80000);
  if ((n & 0xfffffffffffffff0) == 0) {
    uVar14 = 0;
  }
  else {
    uVar14 = 0;
    ppuVar12 = strings;
    do {
      lVar7 = 0;
      do {
        puVar4 = ppuVar12[lVar7];
        if (puVar4 == (uchar *)0x0) goto LAB_0019fa85;
        if (puVar4[depth] == '\0') {
          uVar9 = 0;
        }
        else {
          uVar9 = CONCAT11(puVar4[depth],puVar4[depth + 1]);
        }
        *(undefined2 *)((long)&local_78._M_cur + lVar7 * 2) = uVar9;
        lVar7 = lVar7 + 1;
      } while (lVar7 != 0x10);
      lVar7 = 0;
      __args = ppuVar12;
      do {
        uVar10 = (ulong)((uint)*(ushort *)((long)&local_78._M_cur + lVar7 * 2) * 0x50);
        pdVar1 = (deque<unsigned_char*,std::allocator<unsigned_char*>> *)
                 ((long)&(buckets->
                         super__Deque_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>).
                         _M_impl.super__Deque_impl_data._M_map + uVar10);
        puVar5 = *(undefined8 **)
                  ((long)&(buckets->
                          super__Deque_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>).
                          _M_impl.super__Deque_impl_data._M_finish._M_cur + uVar10);
        if (puVar5 == (undefined8 *)
                      (*(long *)((long)&(buckets->
                                        super__Deque_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>
                                        )._M_impl.super__Deque_impl_data._M_finish._M_last + uVar10)
                      + -8)) {
          std::deque<unsigned_char*,std::allocator<unsigned_char*>>::
          _M_push_back_aux<unsigned_char*const&>(pdVar1,__args);
        }
        else {
          *puVar5 = *__args;
          pdVar1 = pdVar1 + 0x30;
          *(long *)pdVar1 = *(long *)pdVar1 + 8;
        }
        lVar7 = lVar7 + 1;
        __args = __args + 1;
      } while (lVar7 != 0x10);
      uVar14 = uVar14 + 0x10;
      ppuVar12 = ppuVar12 + 0x10;
    } while (uVar14 < (n & 0xfffffffffffffff0));
  }
  lVar7 = n - uVar14;
  if (uVar14 <= n && lVar7 != 0) {
    ppuVar12 = strings + uVar14;
    do {
      puVar4 = *ppuVar12;
      if (puVar4 == (uchar *)0x0) {
LAB_0019fa85:
        __assert_fail("ptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/util/get_char.h"
                      ,0x2e,"uint16_t get_char(unsigned char *, size_t)");
      }
      if (puVar4[depth] == '\0') {
        uVar11 = 0;
      }
      else {
        uVar11 = (uint)CONCAT11(puVar4[depth],puVar4[depth + 1]);
      }
      uVar14 = (ulong)(uVar11 * 0x50);
      pdVar1 = (deque<unsigned_char*,std::allocator<unsigned_char*>> *)
               ((long)&(buckets->
                       super__Deque_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>)._M_impl
                       .super__Deque_impl_data._M_map + uVar14);
      plVar6 = *(long **)((long)&(buckets->
                                 super__Deque_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>
                                 )._M_impl.super__Deque_impl_data._M_finish._M_cur + uVar14);
      if (plVar6 == (long *)(*(long *)((long)&(buckets->
                                              super__Deque_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>
                                              )._M_impl.super__Deque_impl_data._M_finish._M_last +
                                      uVar14) + -8)) {
        std::deque<unsigned_char*,std::allocator<unsigned_char*>>::
        _M_push_back_aux<unsigned_char*const&>(pdVar1,ppuVar12);
      }
      else {
        *plVar6 = (long)puVar4;
        pdVar1 = pdVar1 + 0x30;
        *(long *)pdVar1 = *(long *)pdVar1 + 8;
      }
      ppuVar12 = ppuVar12 + 1;
      lVar7 = lVar7 + -1;
    } while (lVar7 != 0);
  }
  ppppuVar8 = &buckets[1].super__Deque_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>.
               _M_impl.super__Deque_impl_data._M_finish._M_node;
  lVar7 = 0;
  do {
    pppuVar2 = *ppppuVar8;
    lVar13 = (long)ppppuVar8[-10];
    lVar3 = (long)ppppuVar8[-4];
    auVar18._0_4_ = -(uint)((int)lVar13 == 0);
    auVar18._4_4_ = -(uint)((int)((ulong)lVar13 >> 0x20) == 0);
    auVar18._8_4_ = -(uint)((int)pppuVar2 == 0);
    auVar18._12_4_ = -(uint)((int)((ulong)pppuVar2 >> 0x20) == 0);
    auVar16._4_4_ = auVar18._0_4_;
    auVar16._0_4_ = auVar18._4_4_;
    auVar16._8_4_ = auVar18._12_4_;
    auVar16._12_4_ = auVar18._8_4_;
    auVar17._8_4_ = 0xffffffff;
    auVar17._0_8_ = 0xffffffffffffffff;
    auVar17._12_4_ = 0xffffffff;
    auVar17 = auVar16 & auVar18 ^ auVar17;
    uVar14 = (long)((iterator *)(ppppuVar8 + -3))->_M_cur - (long)ppppuVar8[-2];
    auVar19._0_4_ = (undefined4)((ulong)((long)ppppuVar8[-0xd] - (long)ppppuVar8[-0xc]) >> 3);
    auVar19._8_4_ = (undefined4)(uVar14 >> 3);
    auVar19._4_4_ = auVar19._8_4_;
    auVar19._12_4_ = (int)((long)uVar14 >> 0x23);
    auVar20._0_4_ = (undefined4)((ulong)((long)ppppuVar8[-0xf] - (long)ppppuVar8[-0x11]) >> 3);
    auVar20._8_4_ = (undefined4)((ulong)((long)ppppuVar8[-5] - (long)ppppuVar8[-7]) >> 3);
    auVar20._4_4_ = auVar20._8_4_;
    auVar20._12_4_ = (int)((long)ppppuVar8[-5] - (long)ppppuVar8[-7] >> 0x23);
    __ptr[lVar7] = CONCAT44((int)((long)ppppuVar8[-0xf] - (long)ppppuVar8[-0x11] >> 0x23),
                            auVar20._0_4_) +
                   CONCAT44((int)((long)ppppuVar8[-0xd] - (long)ppppuVar8[-0xc] >> 0x23),
                            auVar19._0_4_) +
                   (auVar17._0_8_ + ((ulong)(lVar13 - (long)ppppuVar8[-0xe]) >> 3)) * 0x40;
    (__ptr + lVar7)[1] =
         auVar20._8_8_ + auVar19._8_8_ +
         (auVar17._8_8_ + ((ulong)((long)pppuVar2 - lVar3) >> 3)) * 0x40;
    lVar7 = lVar7 + 2;
    ppppuVar8 = ppppuVar8 + 0x14;
  } while (lVar7 != 0x10000);
  pppuVar15 = &(buckets->super__Deque_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>).
               _M_impl.super__Deque_impl_data._M_finish._M_last;
  lVar7 = 0;
  lVar13 = 0;
  do {
    lVar3 = __ptr[lVar7];
    if (lVar3 != 0) {
      local_78._M_cur = pppuVar15[-6];
      local_78._M_first = pppuVar15[-5];
      local_78._M_last = pppuVar15[-4];
      local_78._M_node = (_Map_pointer)pppuVar15[-3];
      local_58._M_cur = ((iterator *)(pppuVar15 + -2))->_M_cur;
      local_58._M_first = pppuVar15[-1];
      local_58._M_last = *pppuVar15;
      local_58._M_node = (_Map_pointer)pppuVar15[1];
      std::
      __copy_move_dit<false,unsigned_char*,unsigned_char*const&,unsigned_char*const*,unsigned_char**>
                (&local_78,&local_58,strings + lVar13);
      lVar13 = lVar13 + lVar3;
    }
    lVar7 = lVar7 + 1;
    pppuVar15 = pppuVar15 + 10;
  } while (lVar7 != 0x10000);
  lVar7 = 0;
  do {
    std::deque<unsigned_char_*,_std::allocator<unsigned_char_*>_>::clear
              ((deque<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)
               ((long)&(buckets->
                       super__Deque_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>)._M_impl
                       .super__Deque_impl_data._M_map + lVar7));
    lVar7 = lVar7 + 0x50;
  } while (lVar7 != 0x500000);
  lVar7 = *__ptr;
  lVar13 = 1;
  do {
    n_00 = __ptr[lVar13];
    if (n_00 != 0) {
      if ((char)lVar13 != '\0') {
        msd_D_adaptive<std::deque<unsigned_char*,std::allocator<unsigned_char*>>>
                  (strings + lVar7,n_00,depth + 2,buckets);
      }
      lVar7 = lVar7 + n_00;
    }
    lVar13 = lVar13 + 1;
  } while (lVar13 != 0x10000);
  free(__ptr);
  return;
}

Assistant:

static void
msd_D_adaptive(unsigned char** strings, size_t n, size_t depth, Bucket* buckets)
{
	if (n < 0x10000) {
		msd_D<Bucket, uint16_t>(strings, n, depth, buckets);
		return;
	}
	size_t* bucketsize = (size_t*) malloc(0x10000 * sizeof(size_t));
	size_t i=0;
	for (; i < n-n%16; i+=16) {
		uint16_t cache[16];
		for (size_t j=0; j < 16; ++j) {
			cache[j] = get_char<uint16_t>(strings[i+j], depth);
		}
		for (size_t j=0; j < 16; ++j) {
			buckets[cache[j]].push_back(strings[i+j]);
		}
	}
	for (; i < n; ++i) {
		const uint16_t ch = get_char<uint16_t>(strings[i], depth);
		buckets[ch].push_back(strings[i]);
	}
	for (unsigned i=0; i < 0x10000; ++i) {
		bucketsize[i] = buckets[i].size();
	}
	size_t pos = 0;
	for (unsigned i=0; i < 0x10000; ++i) {
		if (bucketsize[i] == 0) continue;
		copy(buckets[i], strings+pos);
		pos += bucketsize[i];
	}
	for (unsigned i=0; i < 0x10000; ++i) {
		buckets[i].clear();
	}
	pos = bucketsize[0];
	for (unsigned i=1; i < 0x10000; ++i) {
		if (bucketsize[i] == 0) continue;
		if (i & 0xFF) msd_D_adaptive(
				strings+pos, bucketsize[i],
				depth+2, buckets);
		pos += bucketsize[i];
	}
	free(bucketsize);
}